

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vumonitor.h
# Opt level: O2

double __thiscall VuMonitor::process(VuMonitor *this,double x)

{
  double dVar1;
  double dVar2;
  
  dVar1 = ABS(x);
  dVar2 = dVar1;
  if (dVar1 <= this->mem_) {
    dVar2 = this->mem_ * this->p_;
    dVar1 = (1.0 - this->p_) * dVar1 + dVar2;
  }
  this->mem_ = dVar2;
  return dVar1;
}

Assistant:

inline double VuMonitor::process(double x)
{
    x = fabs(x);
    if (x > mem_) {
        mem_ = x;
        return x;
    }
    else {
        mem_ *= p_;
        return mem_ + (1.0 - p_) * x;
    }
}